

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void doctest::anon_unknown_15::FatalConditionHandler::reset(void)

{
  ulong local_10;
  size_t i;
  
  if (((anonymous_namespace)::FatalConditionHandler::isSet & 1) != 0) {
    for (local_10 = 0; local_10 < 6; local_10 = local_10 + 1) {
      sigaction(*(int *)((anonymous_namespace)::signalDefs + local_10 * 0x10),
                (sigaction *)
                ((anonymous_namespace)::FatalConditionHandler::oldSigActions + local_10 * 0x98),
                (sigaction *)0x0);
    }
    sigaltstack((sigaltstack *)(anonymous_namespace)::FatalConditionHandler::oldSigStack,
                (sigaltstack *)0x0);
    (anonymous_namespace)::FatalConditionHandler::isSet = 0;
  }
  return;
}

Assistant:

static void reset() {
            if(isSet) {
                // Set signals back to previous values -- hopefully nobody overwrote them in the meantime
                for(std::size_t i = 0; i < DOCTEST_COUNTOF(signalDefs); ++i) {
                    sigaction(signalDefs[i].id, &oldSigActions[i], nullptr);
                }
                // Return the old stack
                sigaltstack(&oldSigStack, nullptr);
                isSet = false;
            }
        }